

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O2

GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,char *procname)

{
  GLFWbool GVar1;
  PFN_vkVoidFunction p_Var2;
  GLFWvkproc p_Var3;
  char *format;
  int error;
  
  if (_glfwInitialized == 0) {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    GVar1 = _glfwInitVulkan();
    if (GVar1 != 0) {
      p_Var2 = (*_glfw.vk.GetInstanceProcAddr)(instance,procname);
      if (p_Var2 != (PFN_vkVoidFunction)0x0) {
        return p_Var2;
      }
      p_Var3 = (GLFWvkproc)dlsym(_glfw.vk.handle,procname);
      return p_Var3;
    }
    format = "Vulkan: API not available";
    error = 0x10006;
  }
  _glfwInputError(error,format);
  return (GLFWvkproc)0x0;
}

Assistant:

GLFWAPI GLFWvkproc glfwGetInstanceProcAddress(VkInstance instance,
                                              const char* procname)
{
    GLFWvkproc proc;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan())
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "Vulkan: API not available");
        return NULL;
    }

    proc = (GLFWvkproc) vkGetInstanceProcAddr(instance, procname);
    if (!proc)
        proc = (GLFWvkproc) _glfw_dlsym(_glfw.vk.handle, procname);

    return proc;
}